

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

SiameseResult __thiscall siamese::Encoder::Get(Encoder *this,SiameseOriginalPacket *originalOut)

{
  EncoderSubwindow *pEVar1;
  uint uVar2;
  OriginalPacket *pOVar3;
  uint uVar4;
  
  if ((this->Window).EmergencyDisabled != false) {
    return Siamese_Disabled;
  }
  uVar4 = originalOut->PacketNum - (this->Window).ColumnStart;
  uVar2 = uVar4 & 0x3fffff;
  if (uVar2 < (this->Window).Count) {
    uVar4 = uVar4 & 0x3f;
    pEVar1 = (this->Window).Subwindows.DataPtr[uVar2 >> 6];
    uVar2 = (pEVar1->Originals)._M_elems[uVar4].Buffer.Bytes;
    if (uVar2 != 0) {
      pOVar3 = (pEVar1->Originals)._M_elems + uVar4;
      uVar4 = pOVar3->HeaderBytes;
      originalOut->PacketNum = pOVar3->Column;
      uVar2 = uVar2 - uVar4;
      originalOut->Data = (pOVar3->Buffer).Data + uVar4;
      originalOut->DataBytes = uVar2;
      if (uVar2 != 0) {
        return Siamese_Success;
      }
      (this->Window).EmergencyDisabled = true;
      return Siamese_Disabled;
    }
  }
  originalOut->Data = (uchar *)0x0;
  originalOut->DataBytes = 0;
  return Siamese_NeedMoreData;
}

Assistant:

SiameseResult Encoder::Get(SiameseOriginalPacket& originalOut)
{
    // Note: Keep this in sync with Decoder::Get

    if (Window.EmergencyDisabled) {
        return Siamese_Disabled;
    }

    // Note: This also works when Count == 0
    SIAMESE_DEBUG_ASSERT(originalOut.PacketNum >= Window.ColumnStart);
    const unsigned element = Window.ColumnToElement(originalOut.PacketNum);
    if (Window.InvalidElement(element))
    {
        // Set default return value
        originalOut.Data      = nullptr;
        originalOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    // Return the packet data
    OriginalPacket* original = Window.GetWindowElement(element);
    if (original->Buffer.Bytes <= 0)
    {
        originalOut.Data      = nullptr;
        originalOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    SIAMESE_DEBUG_ASSERT(original->Column == originalOut.PacketNum);

    // Load original data and length
    if (0 == LoadOriginal(original, originalOut))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    return Siamese_Success;
}